

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall ON_MeshCacheItem::Dump(ON_MeshCacheItem *this,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  element_type *this_00;
  ON_MeshParameters *a;
  ON_MeshParameters *mp;
  char *mp_style;
  ON_Mesh *mesh;
  char buffer [48];
  char *local_20;
  char *description;
  ON_TextLog *text_log_local;
  ON_MeshCacheItem *this_local;
  
  local_20 = (char *)0x0;
  bVar1 = ::operator==(&ON_MeshCache::RenderMeshId,&this->m_mesh_id);
  if (bVar1) {
    local_20 = "Render Mesh";
  }
  else {
    bVar1 = ::operator==(&ON_MeshCache::AnalysisMeshId,&this->m_mesh_id);
    if (bVar1) {
      local_20 = "Analysis Mesh";
    }
    else {
      bVar1 = ::operator==(&ON_MeshCache::PreviewMeshId,&this->m_mesh_id);
      if (bVar1) {
        local_20 = "Preview Mesh";
      }
    }
  }
  if (local_20 == (char *)0x0) {
    memset(&mesh,0,0x30);
    ON_UuidToString(&this->m_mesh_id,(char *)&mesh);
    ON_TextLog::Print(text_log,"mesh id: %s\n",&mesh);
  }
  else {
    ON_TextLog::Print(text_log,"%s\n",local_20);
  }
  ON_TextLog::PushIndent(text_log);
  this_00 = std::__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(this->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
  if (this_00 == (element_type *)0x0) {
    ON_TextLog::Print(text_log,"Null mesh\n");
  }
  else {
    bVar1 = ON_Mesh::IsEmpty(this_00);
    if (bVar1) {
      ON_TextLog::Print(text_log,"Empty mesh\n");
    }
    else {
      mp = (ON_MeshParameters *)anon_var_dwarf_1bfd60;
      a = ON_Mesh::MeshParameters(this_00);
      if (a != (ON_MeshParameters *)0x0) {
        iVar2 = ON_MeshParameters::CompareGeometrySettings(a,&ON_MeshParameters::FastRenderMesh);
        if (iVar2 == 0) {
          mp = (ON_MeshParameters *)anon_var_dwarf_2e60c3;
        }
        else {
          iVar2 = ON_MeshParameters::CompareGeometrySettings
                            (a,&ON_MeshParameters::QualityRenderMesh);
          if (iVar2 == 0) {
            mp = (ON_MeshParameters *)anon_var_dwarf_2e60d0;
          }
        }
      }
      uVar3 = ON_Mesh::FaceCount(this_00);
      uVar4 = ON_Mesh::VertexCount(this_00);
      ON_TextLog::Print(text_log,"%s mesh with %d faces and %d vertices.\n",mp,(ulong)uVar3,
                        (ulong)uVar4);
    }
  }
  ON_TextLog::PopIndent(text_log);
  return;
}

Assistant:

void ON_MeshCacheItem::Dump(
  ON_TextLog& text_log
  ) const
{
  const char* description = nullptr;
  if ( ON_MeshCache::RenderMeshId == m_mesh_id )
    description = "Render Mesh";
  else if ( ON_MeshCache::AnalysisMeshId == m_mesh_id )
    description = "Analysis Mesh";
  else if ( ON_MeshCache::PreviewMeshId == m_mesh_id )
    description = "Preview Mesh";

  if (nullptr != description)
  {
    text_log.Print("%s\n", description);
  }
  else
  {
    char buffer[48] = { 0 };
    ON_UuidToString(m_mesh_id, buffer);
    text_log.Print("mesh id: %s\n",buffer);
  }

  text_log.PushIndent();
  const ON_Mesh* mesh = m_mesh_sp.get();
  if (nullptr == mesh)
    text_log.Print("Null mesh\n");
  else if (mesh->IsEmpty())
    text_log.Print("Empty mesh\n");
  else
  {
    const char* mp_style = "Custom";
    const ON_MeshParameters* mp = mesh->MeshParameters();
    if (mp)
    {
      if (0 == ON_MeshParameters::CompareGeometrySettings(*mp, ON_MeshParameters::FastRenderMesh))
        mp_style = "Fast";
      else if (0 == ON_MeshParameters::CompareGeometrySettings(*mp, ON_MeshParameters::QualityRenderMesh))
        mp_style = "Quality";
    }
    text_log.Print("%s mesh with %d faces and %d vertices.\n", mp_style, mesh->FaceCount(), mesh->VertexCount());
  }
  text_log.PopIndent();
}